

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O0

BlockActivationObject * __thiscall
Js::BlockActivationObject::Clone(BlockActivationObject *this,ScriptContext *scriptContext)

{
  int iVar1;
  int propertyId;
  DynamicType *this_00;
  DynamicTypeHandler *pDVar2;
  Recycler *recycler;
  DynamicObject *this_01;
  Var value_00;
  Var value;
  uint local_30;
  PropertyId propId;
  int i;
  int slotCapacity;
  BlockActivationObject *blockScopeClone;
  DynamicType *type;
  ScriptContext *scriptContext_local;
  BlockActivationObject *this_local;
  
  this_00 = DynamicObject::GetDynamicType((DynamicObject *)this);
  pDVar2 = DynamicType::GetTypeHandler(this_00);
  (*pDVar2->_vptr_DynamicTypeHandler[0x61])();
  recycler = ScriptContext::GetRecycler(scriptContext);
  this_01 = (DynamicObject *)DynamicObject::NewObject<Js::BlockActivationObject>(recycler,this_00);
  pDVar2 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  iVar1 = DynamicTypeHandler::GetSlotCapacity(pDVar2);
  for (local_30 = 0; (int)local_30 < iVar1; local_30 = local_30 + 1) {
    propertyId = (*(this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [8])(this,(ulong)local_30);
    value_00 = DynamicObject::GetSlot((DynamicObject *)this,local_30);
    DynamicObject::SetSlot(this_01,propertyId,false,local_30,value_00);
  }
  return (BlockActivationObject *)this_01;
}

Assistant:

BlockActivationObject* BlockActivationObject::Clone(ScriptContext *scriptContext)
    {
        DynamicType* type = this->GetDynamicType();
#if ENABLE_FIXED_FIELDS
        type->GetTypeHandler()->ClearSingletonInstance(); //We are going to share the type.
#endif

        BlockActivationObject* blockScopeClone = DynamicObject::NewObject<BlockActivationObject>(scriptContext->GetRecycler(), type);
        int slotCapacity = this->GetTypeHandler()->GetSlotCapacity();

        for (int i = 0; i < slotCapacity; i += 1)
        {
            DebugOnly(PropertyId propId = this->GetPropertyId(i));
            Var value = this->GetSlot(i);
            blockScopeClone->SetSlot(SetSlotArguments(propId, i, value));
        }

        return blockScopeClone;
    }